

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

int cpu_memory_rw_debug_arm
              (CPUState *cpu,target_ulong addr,void *ptr,target_ulong len,_Bool is_write)

{
  uint uVar1;
  uc_struct_conflict7 *puVar2;
  _func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *p_Var3;
  _func_int_CPUState_ptr_MemTxAttrs_conflict *p_Var4;
  AddressSpace *as;
  uint uVar5;
  hwaddr hVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong len_00;
  uint uVar11;
  ulong uVar12;
  MemTxAttrs attrs;
  MemTxAttrs in_stack_ffffffffffffffb8;
  
  if ((int)len != 0) {
    uVar8 = len & 0xffffffff;
    uVar12 = addr & 0xffffffff;
    puVar2 = cpu->uc;
    do {
      uVar11 = (uint)uVar12;
      uVar9 = puVar2->init_target_page->mask & uVar11;
      p_Var3 = cpu->cc->get_phys_page_attrs_debug;
      if (p_Var3 == (_func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *)0x0) {
        in_stack_ffffffffffffffb8 = (MemTxAttrs)0x1;
        hVar6 = (*cpu->cc->get_phys_page_debug)((CPUState_conflict *)cpu,(ulong)uVar9);
      }
      else {
        hVar6 = (*p_Var3)((CPUState_conflict *)cpu,(ulong)uVar9,
                          (MemTxAttrs *)&stack0xffffffffffffffb8);
      }
      p_Var4 = cpu->cc->asidx_from_attrs;
      if (p_Var4 == (_func_int_CPUState_ptr_MemTxAttrs_conflict *)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = (*p_Var4)((CPUState_conflict *)cpu,in_stack_ffffffffffffffb8);
        if (((int)uVar5 < 0) || (cpu->num_ases <= (int)uVar5)) {
          __assert_fail("ret < cpu->num_ases && ret >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                        ,0x1a5,"int cpu_asidx_from_attrs(CPUState *, MemTxAttrs)");
        }
      }
      if (hVar6 == 0xffffffffffffffff) {
        return -1;
      }
      uVar1 = puVar2->init_target_page->mask;
      uVar7 = uVar1 + uVar11;
      uVar10 = uVar9 - uVar7;
      len_00 = (ulong)uVar10;
      if ((uint)uVar8 <= uVar10) {
        len_00 = uVar8;
      }
      hVar6 = hVar6 + (~uVar1 & uVar11);
      as = cpu->cpu_ases[uVar5].as;
      if (is_write) {
        address_space_write_rom_arm(as,hVar6,in_stack_ffffffffffffffb8,ptr,len_00);
      }
      else if (uVar9 != uVar7) {
        flatview_read((uc_struct_conflict1 *)as->uc,as->current_map,hVar6,in_stack_ffffffffffffffb8,
                      ptr,len_00);
      }
      ptr = (void *)((long)ptr + len_00);
      uVar12 = (ulong)(uVar11 + (int)len_00);
      uVar9 = (uint)uVar8 - (int)len_00;
      uVar8 = (ulong)uVar9;
    } while (uVar9 != 0);
  }
  return 0;
}

Assistant:

int cpu_memory_rw_debug(CPUState *cpu, target_ulong addr,
                        void *ptr, target_ulong len, bool is_write)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    hwaddr phys_addr;
    target_ulong l, page;
    uint8_t *buf = ptr;

    while (len > 0) {
        int asidx;
        MemTxAttrs attrs;

        page = addr & TARGET_PAGE_MASK;
        phys_addr = cpu_get_phys_page_attrs_debug(cpu, page, &attrs);
        asidx = cpu_asidx_from_attrs(cpu, attrs);
        /* if no physical page mapped, return an error */
        if (phys_addr == -1)
            return -1;
        l = (page + TARGET_PAGE_SIZE) - addr;
        if (l > len)
            l = len;
        phys_addr += (addr & ~TARGET_PAGE_MASK);
        if (is_write) {
            address_space_write_rom(cpu->cpu_ases[asidx].as, phys_addr,
                                    attrs, buf, l);
        } else {
            address_space_read(cpu->cpu_ases[asidx].as, phys_addr, attrs, buf,
                               l);
        }
        len -= l;
        buf += l;
        addr += l;
    }
    return 0;
}